

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O1

mfb_window * mfb_open_ex(char *title,uint width,uint height,uint flags)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  void *pvVar7;
  _Bool _Var8;
  SWindowData *window_data;
  SWindowData *window_data_x11;
  void *pvVar9;
  long lVar10;
  undefined8 uVar11;
  mfb_timer *pmVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int formatCount;
  XSizeHints sizeHints;
  XSetWindowAttributes windowAttributes;
  
  window_data = (SWindowData *)malloc(0x2b0);
  if (window_data != (SWindowData *)0x0) {
    memset(window_data,0,0x2b0);
    window_data_x11 = (SWindowData *)malloc(0x38);
    if (window_data_x11 != (SWindowData *)0x0) {
      window_data_x11->close_func = (mfb_close_func)0x0;
      window_data_x11->keyboard_func = (mfb_keyboard_func)0x0;
      window_data_x11->active_func = (mfb_active_func)0x0;
      window_data_x11->resize_func = (mfb_resize_func)0x0;
      window_data_x11->specific = (void *)0x0;
      window_data_x11->user_data = (void *)0x0;
      window_data_x11->char_input_func = (mfb_char_input_func)0x0;
      window_data->specific = window_data_x11;
      pvVar9 = (void *)XOpenDisplay(0);
      window_data_x11->user_data = pvVar9;
      if (pvVar9 != (void *)0x0) {
        init_keycodes((SWindowData_X11 *)window_data_x11);
        pvVar9 = window_data_x11->user_data;
        iVar1 = *(int *)((long)pvVar9 + 0xe0);
        *(int *)&window_data_x11->active_func = iVar1;
        uVar11 = *(undefined8 *)(*(long *)((long)pvVar9 + 0xe8) + 0x40 + (long)iVar1 * 0x80);
        lVar10 = XListPixmapFormats(pvVar9,&formatCount);
        if (0 < (long)formatCount) {
          lVar14 = *(long *)((long)window_data_x11->user_data + 0xe8);
          iVar1 = *(int *)(lVar14 + 0x38 + (long)*(int *)&window_data_x11->active_func * 0x80);
          uVar6 = *(undefined8 *)
                   (lVar14 + 0x10 + (long)*(int *)((long)window_data_x11->user_data + 0xe0) * 0x80);
          lVar14 = 0;
          do {
            if (iVar1 == *(int *)(lVar10 + lVar14)) {
              iVar2 = *(int *)(lVar10 + 4 + lVar14);
              XFree(lVar10);
              if (iVar2 == 0x20) {
                lVar10 = *(long *)((long)window_data_x11->user_data + 0xe8);
                lVar14 = (long)*(int *)&window_data_x11->active_func * 0x80;
                uVar3 = *(uint *)(lVar10 + 0x18 + lVar14);
                uVar4 = *(uint *)(lVar10 + 0x1c + lVar14);
                windowAttributes.border_pixel = *(unsigned_long *)(lVar10 + 0x60 + lVar14);
                windowAttributes.background_pixel = *(unsigned_long *)(lVar10 + 0x60 + lVar14);
                windowAttributes.backing_store = 0;
                window_data->window_width = width;
                window_data->window_height = height;
                window_data->buffer_width = width;
                window_data->buffer_height = height;
                window_data->buffer_stride = width * 4;
                calc_dst_factor(window_data,width,height);
                uVar15 = 0;
                uVar13 = 0;
                uVar5 = uVar4;
                uVar16 = uVar3;
                if ((flags & 4) == 0) {
                  uVar15 = uVar3 - width >> 1;
                  uVar13 = uVar4 - height >> 1;
                  uVar5 = height;
                  uVar16 = width;
                }
                pvVar9 = (void *)XCreateWindow(window_data_x11->user_data,uVar6,uVar15,uVar13,uVar16
                                               ,uVar5,0,iVar1,1,uVar11,0x4a,&windowAttributes);
                window_data_x11->specific = pvVar9;
                if (pvVar9 == (void *)0x0) {
                  return (mfb_window *)0x0;
                }
                XSelectInput(window_data_x11->user_data,pvVar9,0x22807f);
                XStoreName(window_data_x11->user_data,window_data_x11->specific,title);
                if ((flags & 8) != 0) {
                  sizeHints.x = 0;
                  sizeHints.y = 0;
                  sizeHints.width = 0;
                  sizeHints.height = 0;
                  sizeHints.min_width = 0;
                  sizeHints.min_height = 0;
                  sizeHints.max_width = 0;
                  sizeHints.max_height = 0;
                  sizeHints.flags = 2;
                  uVar11 = XInternAtom(window_data_x11->user_data,"_MOTIF_WM_HINTS",1);
                  XChangeProperty(window_data_x11->user_data,window_data_x11->specific,uVar11,uVar11
                                  ,0x20,0,&sizeHints,5);
                }
                if ((flags & 0x10) != 0) {
                  sizeHints.flags = XInternAtom(window_data_x11->user_data,"_NET_WM_STATE_ABOVE",0);
                  pvVar9 = window_data_x11->specific;
                  pvVar7 = window_data_x11->user_data;
                  uVar11 = XInternAtom(pvVar7,"_NET_WM_STATE",0);
                  XChangeProperty(pvVar7,pvVar9,uVar11,4,0x20,0,&sizeHints,1);
                }
                if ((flags & 2) != 0) {
                  sizeHints.flags =
                       XInternAtom(window_data_x11->user_data,"_NET_WM_STATE_FULLSCREEN",1);
                  pvVar9 = window_data_x11->specific;
                  pvVar7 = window_data_x11->user_data;
                  uVar11 = XInternAtom(pvVar7,"_NET_WM_STATE",1);
                  XChangeProperty(pvVar7,pvVar9,uVar11,4,0x20,0,&sizeHints,1);
                }
                sizeHints.flags = 0x34;
                sizeHints.x = 0;
                sizeHints.y = 0;
                if ((flags & 1) == 0) {
                  uVar4 = height;
                  uVar3 = width;
                }
                sizeHints.min_height = height;
                sizeHints.min_width = width;
                sizeHints.max_height = uVar4;
                sizeHints.max_width = uVar3;
                s_delete_window_atom = XInternAtom(window_data_x11->user_data,"WM_DELETE_WINDOW",0);
                XSetWMProtocols(window_data_x11->user_data,window_data_x11->specific,
                                &s_delete_window_atom,1);
                _Var8 = create_GL_context(window_data);
                if (!_Var8) {
                  return (mfb_window *)0x0;
                }
                XSetWMNormalHints(window_data_x11->user_data,window_data_x11->specific,&sizeHints);
                XClearWindow(window_data_x11->user_data,window_data_x11->specific);
                XMapRaised(window_data_x11->user_data,window_data_x11->specific);
                XFlush(window_data_x11->user_data);
                window_data_x11->resize_func =
                     *(mfb_resize_func *)
                      (*(long *)((long)window_data_x11->user_data + 0xe8) + 0x48 +
                      (long)*(int *)&window_data_x11->active_func * 0x80);
                pmVar12 = mfb_timer_create();
                window_data_x11->char_input_func = (mfb_char_input_func)pmVar12;
                mfb_set_keyboard_callback((mfb_window *)window_data,keyboard_default);
                window_data->is_initialized = true;
                return (mfb_window *)window_data;
              }
              goto LAB_001034ce;
            }
            lVar14 = lVar14 + 0xc;
          } while ((long)formatCount * 0xc != lVar14);
        }
        XFree(lVar10);
LAB_001034ce:
        XCloseDisplay(window_data_x11->user_data);
        return (mfb_window *)0x0;
      }
      free(window_data);
      window_data = window_data_x11;
    }
    free(window_data);
  }
  return (mfb_window *)0x0;
}

Assistant:

struct mfb_window *
mfb_open_ex(const char *title, unsigned width, unsigned height, unsigned flags) {
    int depth, i, formatCount, convDepth = -1;
    XPixmapFormatValues* formats;
    XSetWindowAttributes windowAttributes;
    XSizeHints sizeHints;
    Visual* visual;

    SWindowData *window_data = (SWindowData *) malloc(sizeof(SWindowData));
    if (!window_data) {
        return 0x0;
    }
    memset(window_data, 0, sizeof(SWindowData));

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) malloc(sizeof(SWindowData_X11));
    if (!window_data_x11) {
        free(window_data);
        return 0x0;
    }
    memset(window_data_x11, 0, sizeof(SWindowData_X11));
    window_data->specific = window_data_x11;

    window_data_x11->display = XOpenDisplay(0);
    if (!window_data_x11->display) {
        free(window_data);
        free(window_data_x11);
        return 0x0;
    }

    init_keycodes(window_data_x11);

    window_data_x11->screen = DefaultScreen(window_data_x11->display);

    visual   = DefaultVisual(window_data_x11->display, window_data_x11->screen);
    formats  = XListPixmapFormats(window_data_x11->display, &formatCount);
    depth    = DefaultDepth(window_data_x11->display, window_data_x11->screen);

    Window defaultRootWindow = DefaultRootWindow(window_data_x11->display);

    for (i = 0; i < formatCount; ++i)
    {
        if (depth == formats[i].depth)
        {
            convDepth = formats[i].bits_per_pixel;
            break;
        }
    }

    XFree(formats);

    // We only support 32-bit right now
    if (convDepth != 32)
    {
        XCloseDisplay(window_data_x11->display);
        return 0x0;
    }

    int screenWidth  = DisplayWidth(window_data_x11->display, window_data_x11->screen);
    int screenHeight = DisplayHeight(window_data_x11->display, window_data_x11->screen);

    windowAttributes.border_pixel     = BlackPixel(window_data_x11->display, window_data_x11->screen);
    windowAttributes.background_pixel = BlackPixel(window_data_x11->display, window_data_x11->screen);
    windowAttributes.backing_store    = NotUseful;

    int posX, posY;
    int windowWidth, windowHeight;

    window_data->window_width  = width;
    window_data->window_height = height;
    window_data->buffer_width  = width;
    window_data->buffer_height = height;
    window_data->buffer_stride = width * 4;
    calc_dst_factor(window_data, width, height);

    if (flags & WF_FULLSCREEN_DESKTOP) {
        posX         = 0;
        posY         = 0;
        windowWidth  = screenWidth;
        windowHeight = screenHeight;
    }
    else {
        posX         = (screenWidth  - width)  / 2;
        posY         = (screenHeight - height) / 2;
        windowWidth  = width;
        windowHeight = height;
    }

    window_data_x11->window = XCreateWindow(
                    window_data_x11->display,
                    defaultRootWindow,
                    posX, posY,
                    windowWidth, windowHeight,
                    0,
                    depth,
                    InputOutput,
                    visual,
                    CWBackPixel | CWBorderPixel | CWBackingStore,
                    &windowAttributes);
    if (!window_data_x11->window)
        return 0x0;

    XSelectInput(window_data_x11->display, window_data_x11->window,
        KeyPressMask | KeyReleaseMask
        | ButtonPressMask | ButtonReleaseMask | PointerMotionMask
        | StructureNotifyMask | ExposureMask
        | FocusChangeMask
        | EnterWindowMask | LeaveWindowMask
    );

    XStoreName(window_data_x11->display, window_data_x11->window, title);

    if (flags & WF_BORDERLESS) {
        struct StyleHints {
            unsigned long   flags;
            unsigned long   functions;
            unsigned long   decorations;
            long            inputMode;
            unsigned long   status;
        } sh = {
            .flags       = 2,
            .functions   = 0,
            .decorations = 0,
            .inputMode   = 0,
            .status      = 0,
        };
        Atom sh_p = XInternAtom(window_data_x11->display, "_MOTIF_WM_HINTS", True);
        XChangeProperty(window_data_x11->display, window_data_x11->window, sh_p, sh_p, 32, PropModeReplace, (unsigned char*)&sh, 5);
    }

    if (flags & WF_ALWAYS_ON_TOP) {
        Atom sa_p = XInternAtom(window_data_x11->display, "_NET_WM_STATE_ABOVE", False);
        XChangeProperty(window_data_x11->display, window_data_x11->window, XInternAtom(window_data_x11->display, "_NET_WM_STATE", False), XA_ATOM, 32, PropModeReplace, (unsigned char *)&sa_p, 1);
    }

    if (flags & WF_FULLSCREEN) {
        Atom sf_p = XInternAtom(window_data_x11->display, "_NET_WM_STATE_FULLSCREEN", True);
        XChangeProperty(window_data_x11->display, window_data_x11->window, XInternAtom(window_data_x11->display, "_NET_WM_STATE", True), XA_ATOM, 32, PropModeReplace, (unsigned char*)&sf_p, 1);
    }

    sizeHints.flags      = PPosition | PMinSize | PMaxSize;
    sizeHints.x          = 0;
    sizeHints.y          = 0;
    sizeHints.min_width  = width;
    sizeHints.min_height = height;
    if (flags & WF_RESIZABLE) {
        sizeHints.max_width  = screenWidth;
        sizeHints.max_height = screenHeight;
    }
    else {
        sizeHints.max_width  = width;
        sizeHints.max_height = height;
    }

    s_delete_window_atom = XInternAtom(window_data_x11->display, "WM_DELETE_WINDOW", False);
    XSetWMProtocols(window_data_x11->display, window_data_x11->window, &s_delete_window_atom, 1);

#if defined(USE_OPENGL_API)
    if(create_GL_context(window_data) == false) {
        return 0x0;
    }

#else
    window_data_x11->image = XCreateImage(window_data_x11->display, CopyFromParent, depth, ZPixmap, 0, 0x0, width, height, 32, width * 4);
#endif

    XSetWMNormalHints(window_data_x11->display, window_data_x11->window, &sizeHints);
    XClearWindow(window_data_x11->display, window_data_x11->window);
    XMapRaised(window_data_x11->display, window_data_x11->window);
    XFlush(window_data_x11->display);

    window_data_x11->gc = DefaultGC(window_data_x11->display, window_data_x11->screen);

    window_data_x11->timer = mfb_timer_create();

    mfb_set_keyboard_callback((struct mfb_window *) window_data, keyboard_default);

#if defined(_DEBUG) || defined(DEBUG)
    printf("Window created using X11 API\n");
#endif

    window_data->is_initialized = true;
    return (struct mfb_window *) window_data;
}